

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.scanner.c
# Opt level: O3

void yyunput(int c,char *yy_bp)

{
  YY_BUFFER_STATE *ppyVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  YY_BUFFER_STATE pyVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  
  pcVar3 = yy_c_buf_p;
  *yy_c_buf_p = yy_hold_char;
  sVar2 = yy_buffer_stack_top;
  ppyVar1 = yy_buffer_stack;
  pyVar5 = yy_buffer_stack[yy_buffer_stack_top];
  pcVar4 = pyVar5->yy_ch_buf;
  if (pcVar3 < pcVar4 + 2) {
    lVar8 = (long)yy_n_chars;
    yy_n_chars = pyVar5->yy_buf_size;
    pcVar7 = pcVar4 + (long)yy_n_chars + 2;
    pcVar9 = pcVar4 + lVar8 + 2;
    if (pcVar4 < pcVar9) {
      do {
        pcVar4 = pcVar9 + -1;
        pcVar9 = pcVar9 + -1;
        pcVar7[-1] = *pcVar4;
        pcVar7 = pcVar7 + -1;
        pyVar5 = ppyVar1[sVar2];
        pcVar4 = pyVar5->yy_ch_buf;
      } while (pcVar4 < pcVar9);
      yy_n_chars = pyVar5->yy_buf_size;
    }
    iVar6 = (int)pcVar7 - (int)pcVar9;
    pcVar3 = pcVar3 + iVar6;
    pyVar5->yy_n_chars = yy_n_chars;
    if (pcVar3 < pcVar4 + 2) {
      yy_fatal_error("flex scanner push-back overflow");
    }
    yy_bp = yy_bp + iVar6;
  }
  pcVar3[-1] = (char)c;
  yytext = yy_bp;
  yy_hold_char = pcVar3[-1];
  yy_c_buf_p = pcVar3 + -1;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp )
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}